

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O3

Vec_Int_t * Wlc_ReduceMarkedInitVec(Wlc_Ntk_t *p,Vec_Int_t *vInit)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int *__src;
  int *piVar5;
  Vec_Int_t *pVVar6;
  int *__dest;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  size_t __size;
  
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  iVar2 = vInit->nSize;
  pVVar6->nCap = iVar2;
  if ((long)iVar2 == 0) {
    __size = 0;
    __dest = (int *)0x0;
  }
  else {
    __size = (long)iVar2 * 4;
    __dest = (int *)malloc(__size);
  }
  pVVar6->pArray = __dest;
  __src = vInit->pArray;
  memcpy(__dest,__src,__size);
  iVar3 = (p->vPis).nSize;
  uVar4 = (p->vCis).nSize;
  if (iVar2 != uVar4 - iVar3) {
    __assert_fail("Vec_IntSize(vInit) == Wlc_NtkCiNum(p) - Wlc_NtkPiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcNtk.c"
                  ,0x365,"Vec_Int_t *Wlc_ReduceMarkedInitVec(Wlc_Ntk_t *, Vec_Int_t *)");
  }
  if ((int)uVar4 < 1) {
    uVar7 = 0;
  }
  else {
    piVar5 = (p->vCis).pArray;
    uVar8 = 0;
    uVar7 = 0;
    do {
      iVar9 = piVar5[uVar8];
      if (((long)iVar9 < 1) || (p->nObjsAlloc <= iVar9)) {
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      if ((char)*(ushort *)(p->pObjs + iVar9) < '\0' && (*(ushort *)(p->pObjs + iVar9) & 0x3f) != 1)
      {
        uVar1 = (uint)-iVar3 + uVar8;
        iVar9 = (int)uVar1;
        if ((iVar9 < 0) || (iVar2 <= iVar9)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if (((int)uVar7 < 0) || (iVar2 <= (int)uVar7)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        uVar10 = (ulong)uVar7;
        uVar7 = uVar7 + 1;
        __dest[uVar10] = __src[uVar1 & 0xffffffff];
      }
      uVar8 = uVar8 + 1;
    } while (uVar4 != uVar8);
  }
  if (iVar2 < (int)uVar7) {
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
  }
  pVVar6->nSize = uVar7;
  return pVVar6;
}

Assistant:

Vec_Int_t * Wlc_ReduceMarkedInitVec( Wlc_Ntk_t * p, Vec_Int_t * vInit )
{
    Vec_Int_t * vInitNew = Vec_IntDup( vInit );
    Wlc_Obj_t * pObj; int i, k = 0;
    assert( Vec_IntSize(vInit) == Wlc_NtkCiNum(p) - Wlc_NtkPiNum(p) );
    Wlc_NtkForEachCi( p, pObj, i )
        if ( !Wlc_ObjIsPi(pObj) && pObj->Mark )
            Vec_IntWriteEntry( vInitNew, k++, Vec_IntEntry(vInit, i - Wlc_NtkPiNum(p)) );
    Vec_IntShrink( vInitNew, k );
    return vInitNew;
}